

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O0

bool __thiscall
t_php_generator::needs_php_write_validator(t_php_generator *this,t_struct *tstruct,bool is_result)

{
  bool bVar1;
  int iVar2;
  members_type *fields;
  bool local_1a;
  bool is_result_local;
  t_struct *tstruct_local;
  t_php_generator *this_local;
  
  local_1a = false;
  if (((this->validate_ & 1U) != 0) && (local_1a = false, !is_result)) {
    bVar1 = t_struct::is_union(tstruct);
    local_1a = false;
    if (!bVar1) {
      fields = t_struct::get_members(tstruct);
      iVar2 = get_php_num_required_fields(this,fields,true);
      local_1a = 0 < iVar2;
    }
  }
  return local_1a;
}

Assistant:

bool t_php_generator::needs_php_write_validator(t_struct* tstruct, bool is_result) {
  return (validate_ && !is_result && !tstruct->is_union()
          && get_php_num_required_fields(tstruct->get_members(), true) > 0);
}